

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filekeyvaluestore.cpp
# Opt level: O0

Set __thiscall
groundupdbext::FileKeyValueStore::getKeyValueSet(FileKeyValueStore *this,HashedValue *key)

{
  bool bVar1;
  size_t __val;
  pointer __lhs;
  size_type __n;
  HashedValue *in_RDX;
  value_type local_3d9;
  value_type *local_3d8;
  char *c;
  iterator __end3;
  iterator __begin3;
  string *__range3;
  size_t sStack_3b0;
  int i;
  size_t hashSize;
  size_t lengthSize;
  size_t hash;
  undefined1 local_390 [4];
  int length;
  Bytes bytes;
  string cd;
  Type local_350;
  int tint;
  Type type;
  bool hasValue;
  string eol;
  undefined1 local_320 [4];
  int entries;
  unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
  values;
  ifstream t;
  path local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string fp;
  string keyHash;
  HashedValue *key_local;
  FileKeyValueStore *this_local;
  
  __val = groundupdb::HashedValue::hash(in_RDX);
  std::__cxx11::to_string((string *)((long)&fp.field_2 + 8),__val);
  __lhs = std::
          unique_ptr<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
          ::operator->((unique_ptr<groundupdbext::FileKeyValueStore::Impl,_std::default_delete<groundupdbext::FileKeyValueStore::Impl>_>
                        *)&key->m_has_value);
  std::operator+(&local_a0,&__lhs->m_fullpath,"/");
  std::operator+(&local_80,&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&fp.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 &local_80,".kv");
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
             ,auto_format);
  bVar1 = std::filesystem::exists(&local_d8);
  std::filesystem::__cxx11::path::~path(&local_d8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::ifstream::ifstream(&values._M_h._M_single_bucket,(string *)local_60,_S_in);
    std::
    unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
    ::unordered_set((unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
                     *)local_320);
    std::__cxx11::string::string((string *)&type);
    std::istream::operator>>(&values._M_h._M_single_bucket,(int *)(eol.field_2._M_local_buf + 0xc));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&values._M_h._M_single_bucket,(string *)&type);
    std::__cxx11::string::string
              ((string *)
               &bytes.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)local_390);
    hash._4_4_ = 0;
    lengthSize = 0;
    hashSize = 4;
    sStack_3b0 = 8;
    for (__range3._4_4_ = 0; __range3._4_4_ < (int)eol.field_2._12_4_;
        __range3._4_4_ = __range3._4_4_ + 1) {
      std::istream::operator>>(&values._M_h._M_single_bucket,(bool *)((long)&tint + 3));
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&values._M_h._M_single_bucket,(string *)&type);
      if ((tint._3_1_ & 1) == 0) {
        hash._4_4_ = 0;
        local_350 = UNKNOWN;
        lengthSize = 0;
      }
      else {
        std::__cxx11::string::clear();
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&values._M_h._M_single_bucket,
                   (string *)
                   &bytes.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        local_350 = std::__cxx11::stoi((string *)
                                       &bytes.
                                        super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (size_t *)0x0,10);
        std::__cxx11::string::clear();
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&values._M_h._M_single_bucket,
                   (string *)
                   &bytes.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        hash._4_4_ = std::__cxx11::stoi((string *)
                                        &bytes.
                                         super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage,&hashSize
                                        ,10);
        std::__cxx11::string::clear();
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&values._M_h._M_single_bucket,
                   (string *)
                   &bytes.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<std::byte,_std::allocator<std::byte>_>::clear
                  ((vector<std::byte,_std::allocator<std::byte>_> *)local_390);
        __n = std::__cxx11::string::length();
        std::vector<std::byte,_std::allocator<std::byte>_>::reserve
                  ((vector<std::byte,_std::allocator<std::byte>_> *)local_390,__n);
        __end3._M_current = (char *)std::__cxx11::string::begin();
        c = (char *)std::__cxx11::string::end();
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end3,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&c);
          if (!bVar1) break;
          local_3d8 = (value_type *)
                      __gnu_cxx::
                      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&__end3);
          local_3d9 = *local_3d8;
          std::vector<std::byte,_std::allocator<std::byte>_>::push_back
                    ((vector<std::byte,_std::allocator<std::byte>_> *)local_390,&local_3d9);
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end3);
        }
        std::__cxx11::string::clear();
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&values._M_h._M_single_bucket,
                   (string *)
                   &bytes.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        lengthSize = std::__cxx11::stoul((string *)
                                         &bytes.
                                          super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                                         &stack0xfffffffffffffc50,10);
        std::__cxx11::string::clear();
      }
      std::
      unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>
      ::
      emplace<groundupdb::Type&,std::vector<std::byte,std::allocator<std::byte>>&,int&,unsigned_long&>
                ((unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>
                  *)local_320,&local_350,(vector<std::byte,_std::allocator<std::byte>_> *)local_390,
                 (int *)((long)&hash + 4),&lengthSize);
    }
    std::
    make_unique<std::unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>,std::unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>&>
              ((unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
                *)this);
    std::vector<std::byte,_std::allocator<std::byte>_>::~vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)local_390);
    std::__cxx11::string::~string
              ((string *)
               &bytes.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&type);
    std::
    unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
    ::~unordered_set((unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
                      *)local_320);
    std::ifstream::~ifstream(&values._M_h._M_single_bucket);
  }
  else {
    std::
    make_unique<std::unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>>
              ();
  }
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(fp.field_2._M_local_buf + 8));
  return (__uniq_ptr_data<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>,_true,_true>
          )(__uniq_ptr_data<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>,_true,_true>
            )this;
}

Assistant:

Set
FileKeyValueStore::getKeyValueSet(const HashedValue& key) {
  // get from _string_set.kl file
  std::string keyHash(std::to_string(key.hash()));
  std::string fp(mImpl->m_fullpath + "/" + keyHash + ".kv");
  if (!fs::exists(fp)) {
    //std::cout << "FileKeyValueStore::getKeyValueSet returning empty set" << std::endl;
    return std::make_unique<std::unordered_set<EncodedValue>>(); // TODO verify we don't need to specify type here
  }
  std::ifstream t(fp);
  std::unordered_set<EncodedValue> values;

  // read size first
  int entries;
  std::string eol; // eol can be multiple characters
  t >> entries;
  std::getline(t,eol);

  // Each value information
  bool hasValue;
  groundupdb::Type type;
  int tint;
  std::string cd;
  Bytes bytes;
  int length = 0;
  std::size_t hash = 0;
  std::size_t lengthSize = sizeof(length);
  std::size_t hashSize = sizeof(hash);
  for (int i = 0;i < entries;i++) {
    // read hasValue
    t >> hasValue;
    std::getline(t,eol);
    if (hasValue) {
      //std::cout << "  Entry has value" << std::endl;
      // type
      cd.clear();
      std::getline(t,cd);
      //std::cout << "    Type string: " << cd << std::endl;
      //t >> tint; // DOESN'T WORK!
      tint = std::stoi(cd);
      type = (groundupdb::Type)tint;
      // length
      cd.clear();
      std::getline(t,cd);
      //std::cout << "    Length string: " << cd << std::endl;
      //t >> length; // DOESN'T WORK!
      length = std::stoi(cd,&lengthSize);
      // data
      cd.clear();
      std::getline(t,cd);
      bytes.clear();
      bytes.reserve(cd.length());
      //std::cout << "    Expecting " << length << " bytes, read line of " << cd.length() << " bytes" << std::endl;
      //std::cout << "    Reading bytes: ";
      for (auto& c : cd) {
        //std::cout << ".";
        bytes.push_back((std::byte)c);
      }
      //std::cout << std::endl;
      // hash
      cd.clear();
      std::getline(t,cd);
      //std::cout << "    Read hash value (string) of: " << cd << std::endl;
      //t >> hash; // DOESN'T WORK!
      hash = std::stoul(cd,&hashSize);
      //std::cout << "    Reading and creating SET value with length: " << length << ", hash: " << hash << std::endl;
      cd.clear();
    } else {
      //std::cout << "  Entry DOES NOT have value" << std::endl;
      length = 0;
      type = groundupdb::Type::UNKNOWN;
      hash = 0;
    }
    values.emplace(type,bytes,length,hash);
  }
  //std::cout << "FileKeyValueStore::getKeyValueSet returning read results of size: " << values.size() << ", but entries in file of: " << entries << std::endl;
  return std::make_unique<std::unordered_set<EncodedValue>>(values);
}